

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

void Acb_ObjDeriveTfo(Acb_Ntk_t *p,int Pivot,int nTfoLevMax,int nFanMax,Vec_Int_t **pvTfo,
                     Vec_Int_t **pvRoots,int fDelay)

{
  int iVar1;
  int *piVar2;
  int iVar3;
  Vec_Int_t *vTfo;
  int *piVar4;
  Vec_Int_t *vRoots;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  
  iVar3 = Acb_ObjLabelTfo(p,Pivot,nTfoLevMax,nFanMax,fDelay);
  vTfo = (Vec_Int_t *)malloc(0x10);
  vTfo->nCap = 0x10;
  vTfo->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  vTfo->pArray = piVar4;
  *pvTfo = vTfo;
  vRoots = (Vec_Int_t *)malloc(0x10);
  vRoots->nCap = 0x10;
  vRoots->nSize = 0;
  piVar4 = (int *)malloc(0x40);
  vRoots->pArray = piVar4;
  *pvRoots = vRoots;
  if (iVar3 != 0) {
    return;
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar5 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar5) {
      piVar4 = (p->vObjTrav).pArray;
      if (piVar4 == (int *)0x0) {
        piVar4 = (int *)malloc((long)(int)uVar5 << 2);
      }
      else {
        piVar4 = (int *)realloc(piVar4,(long)(int)uVar5 << 2);
      }
      (p->vObjTrav).pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar5;
    }
    if (0 < (int)uVar5) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar5 * 4);
    }
    (p->vObjTrav).nSize = uVar5;
  }
  p->nObjTravs = p->nObjTravs + 1;
  Acb_ObjDeriveTfo_rec(p,Pivot,vTfo,vRoots,fDelay);
  iVar3 = vTfo->nSize;
  if (0 < (long)iVar3) {
    piVar4 = vTfo->pArray;
    if (piVar4[(long)iVar3 + -1] != Pivot) {
      __assert_fail("Vec_IntEntryLast(vTfo) == Pivot",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                    ,0x281,
                    "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
                   );
    }
    uVar5 = iVar3 - 1;
    vTfo->nSize = uVar5;
    uVar6 = (ulong)vRoots->nSize;
    if (0 < (long)uVar6) {
      piVar2 = vRoots->pArray;
      if (piVar2[uVar6 - 1] == Pivot) {
        __assert_fail("Vec_IntEntryLast(vRoots) != Pivot",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbMfs.c"
                      ,0x283,
                      "void Acb_ObjDeriveTfo(Acb_Ntk_t *, int, int, int, Vec_Int_t **, Vec_Int_t **, int)"
                     );
      }
      if (1 < uVar5) {
        iVar3 = -1;
        lVar7 = 0;
        do {
          iVar1 = piVar4[lVar7];
          piVar4[lVar7] = piVar4[(int)(uVar5 + iVar3)];
          piVar4[vTfo->nSize + iVar3] = iVar1;
          lVar7 = lVar7 + 1;
          uVar5 = vTfo->nSize;
          iVar3 = iVar3 + -1;
        } while (lVar7 < (int)uVar5 / 2);
        uVar6 = (ulong)(uint)vRoots->nSize;
      }
      if ((int)uVar6 < 2) {
        return;
      }
      iVar3 = -1;
      lVar7 = 0;
      do {
        iVar1 = piVar2[lVar7];
        piVar2[lVar7] = piVar2[(int)uVar6 + iVar3];
        piVar2[vRoots->nSize + iVar3] = iVar1;
        lVar7 = lVar7 + 1;
        uVar6 = (ulong)(uint)vRoots->nSize;
        iVar3 = iVar3 + -1;
      } while (lVar7 < vRoots->nSize / 2);
      return;
    }
  }
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x201,"int Vec_IntEntryLast(Vec_Int_t *)");
}

Assistant:

void Acb_ObjDeriveTfo( Acb_Ntk_t * p, int Pivot, int nTfoLevMax, int nFanMax, Vec_Int_t ** pvTfo, Vec_Int_t ** pvRoots, int fDelay )
{
    int Res = Acb_ObjLabelTfo( p, Pivot, nTfoLevMax, nFanMax, fDelay );
    Vec_Int_t * vTfo   = *pvTfo   = Vec_IntAlloc( 10 );
    Vec_Int_t * vRoots = *pvRoots = Vec_IntAlloc( 10 );
    if ( Res ) // none or root
        return;
    Acb_NtkIncTravId( p ); // root (2)   inner (1)  visited (0)
    Acb_ObjDeriveTfo_rec( p, Pivot, vTfo, vRoots, fDelay );
    assert( Vec_IntEntryLast(vTfo) == Pivot );
    Vec_IntPop( vTfo );
    assert( Vec_IntEntryLast(vRoots) != Pivot );
    Vec_IntReverseOrder( vTfo );
    Vec_IntReverseOrder( vRoots );
}